

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

int lys_set_disabled(lys_module *module)

{
  ly_ctx *ctx_00;
  lys_module *node;
  lys_node *plVar1;
  long lVar2;
  bool bVar3;
  ly_set *set;
  uint local_44;
  uint local_40;
  uint v;
  uint u;
  int o;
  int i;
  uint8_t imported;
  uint8_t j;
  ly_set *mods;
  lys_module *mod;
  ly_ctx *ctx;
  lys_module *module_local;
  
  if (module == (lys_module *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_set_disabled");
    module_local._4_4_ = 1;
  }
  else {
    if ((*(ushort *)&module->field_0x40 >> 6 & 1) == 0) {
      ctx_00 = module->ctx;
      for (u = 0; (int)u < (int)(uint)ctx_00->internal_module_count; u = u + 1) {
        if (module == (ctx_00->models).list[(int)u]) {
          ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Internal module \"%s\" cannot be disabled.",module->name
                );
          return 1;
        }
      }
      *(ushort *)&module->field_0x40 = *(ushort *)&module->field_0x40 & 0xffbf | 0x40;
      set = ly_set_new();
      ly_set_add(set,module,0);
LAB_0010e419:
      u = (uint)ctx_00->internal_module_count;
      do {
        if ((ctx_00->models).used <= (int)u) {
          for (local_40 = 0; local_40 < set->number; local_40 = local_40 + 1) {
            *(ushort *)&(set->set).s[local_40]->parent =
                 *(ushort *)&(set->set).s[local_40]->parent & 0xffbf;
          }
          ctx_modules_undo_backlinks(ctx_00,set);
          local_40 = set->number;
          while (local_40 != 0) {
            lys_sub_module_remove_devs_augs((lys_module *)(set->set).s[local_40 - 1]);
            local_40 = local_40 - 1;
          }
          for (local_40 = 0; local_40 < set->number; local_40 = local_40 + 1) {
            plVar1 = (set->set).s[local_40];
            *(ushort *)&plVar1->parent = *(ushort *)&plVar1->parent & 0xffbf | 0x40;
            for (local_44 = 0; local_44 < *(byte *)((long)&plVar1->parent + 6);
                local_44 = local_44 + 1) {
              lVar2 = *(long *)(*(long *)plVar1->hash + (ulong)local_44 * 0x30);
              *(byte *)(lVar2 + 0x40) = *(byte *)(lVar2 + 0x40) & 0xbf | 0x40;
            }
          }
          ly_set_free(set);
          (ctx_00->models).module_set_id = (ctx_00->models).module_set_id + 1;
          return 0;
        }
        node = (ctx_00->models).list[(int)u];
        if ((*(ushort *)&node->field_0x40 >> 6 & 1) == 0) {
          for (o._3_1_ = 0; o._3_1_ < node->imp_size; o._3_1_ = o._3_1_ + 1) {
            for (local_40 = 0; local_40 < set->number; local_40 = local_40 + 1) {
              if (node->imp[o._3_1_].module == (lys_module *)(set->set).s[local_40]) {
                *(ushort *)&node->field_0x40 = *(ushort *)&node->field_0x40 & 0xffbf | 0x40;
                ly_set_add(set,node,0);
                goto LAB_0010e419;
              }
            }
          }
          if ((*(ushort *)&node->field_0x40 >> 7 & 1) == 0) {
            bVar3 = false;
            for (v = (uint)ctx_00->internal_module_count; (int)v < (ctx_00->models).used; v = v + 1)
            {
              if ((*(ushort *)&(ctx_00->models).list[(int)v]->field_0x40 >> 6 & 1) == 0) {
                for (o._3_1_ = 0; o._3_1_ < (ctx_00->models).list[(int)v]->imp_size;
                    o._3_1_ = o._3_1_ + 1) {
                  if ((ctx_00->models).list[(int)v]->imp[o._3_1_].module == node) {
                    bVar3 = true;
                    goto LAB_0010e5be;
                  }
                }
              }
            }
LAB_0010e5be:
            if (!bVar3) {
              *(ushort *)&node->field_0x40 = *(ushort *)&node->field_0x40 & 0xffbf | 0x40;
              ly_set_add(set,node,0);
              if (node->imp_size != '\0') goto LAB_0010e419;
            }
          }
        }
        u = u + 1;
      } while( true );
    }
    module_local._4_4_ = 0;
  }
  return module_local._4_4_;
}

Assistant:

API int
lys_set_disabled(const struct lys_module *module)
{
    struct ly_ctx *ctx; /* shortcut */
    struct lys_module *mod;
    struct ly_set *mods;
    uint8_t j, imported;
    int i, o;
    unsigned int u, v;

    if (!module) {
        LOGARG;
        return EXIT_FAILURE;
    } else if (module->disabled) {
        /* already disabled module */
        return EXIT_SUCCESS;
    }
    mod = (struct lys_module *)module;
    ctx = mod->ctx;

    /* avoid disabling internal modules */
    for (i = 0; i < ctx->internal_module_count; i++) {
        if (mod == ctx->models.list[i]) {
            LOGERR(ctx, LY_EINVAL, "Internal module \"%s\" cannot be disabled.", mod->name);
            return EXIT_FAILURE;
        }
    }

    /* disable the module */
    mod->disabled = 1;

    /* get the complete list of modules to disable because of dependencies,
     * we are going also to disable all the imported (not implemented) modules
     * that are not used in any other module */
    mods = ly_set_new();
    ly_set_add(mods, mod, 0);
checkdependency:
    for (i = ctx->internal_module_count; i < ctx->models.used; i++) {
        mod = ctx->models.list[i]; /* shortcut */
        if (mod->disabled) {
            /* skip the already disabled modules */
            continue;
        }

        /* check depndency of imported modules */
        for (j = 0; j < mod->imp_size; j++) {
            for (u = 0; u < mods->number; u++) {
                if (mod->imp[j].module == mods->set.g[u]) {
                    /* module is importing some module to disable, so it must be also disabled */
                    mod->disabled = 1;
                    ly_set_add(mods, mod, 0);
                    /* we have to start again because some of the already checked modules can
                     * depend on the one we have just decided to disable */
                    goto checkdependency;
                }
            }
        }
        /* check if the imported module is used in any module supposed to be kept */
        if (!mod->implemented) {
            imported = 0;
            for (o = ctx->internal_module_count; o < ctx->models.used; o++) {
                if (ctx->models.list[o]->disabled) {
                    /* skip modules already disabled */
                    continue;
                }
                for (j = 0; j < ctx->models.list[o]->imp_size; j++) {
                    if (ctx->models.list[o]->imp[j].module == mod) {
                        /* the module is used in some other module not yet selected to be disabled */
                        imported = 1;
                        goto imported;
                    }
                }
            }
imported:
            if (!imported) {
                /* module is not implemented and neither imported by any other module in context
                 * which is supposed to be kept enabled after this operation, so we are going to disable also
                 * this module */
                mod->disabled = 1;
                ly_set_add(mods, mod, 0);
                /* we have to start again, this time not because other module can depend on this one
                 * (we know that there is no such module), but because the module can import module
                 * that could became useless. If there are no imports, we can continue */
                if (mod->imp_size) {
                    goto checkdependency;
                }
            }
        }
    }

    /* before removing applied deviations, augments and updating leafrefs, we have to enable the modules
     * to disable to allow all that operations */
    for (u = 0; u < mods->number; u++) {
        ((struct lys_module *)mods->set.g[u])->disabled = 0;
    }

    /* maintain backlinks (start with internal ietf-yang-library which have leafs as possible targets of leafrefs */
    ctx_modules_undo_backlinks(ctx, mods);

    /* remove the applied deviations and augments */
    u = mods->number;
    while (u--) {
        lys_sub_module_remove_devs_augs((struct lys_module *)mods->set.g[u]);
    }

    /* now again disable the modules to disable and disable also all its submodules */
    for (u = 0; u < mods->number; u++) {
        mod = (struct lys_module *)mods->set.g[u];
        mod->disabled = 1;
        for (v = 0; v < mod->inc_size; v++) {
            mod->inc[v].submodule->disabled = 1;
        }
    }

    /* free the set */
    ly_set_free(mods);

    /* update the module-set-id */
    ctx->models.module_set_id++;

    return EXIT_SUCCESS;
}